

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzintrulelist.cpp
# Opt level: O1

void __thiscall TPZIntRuleList::~TPZIntRuleList(TPZIntRuleList *this)

{
  TPZGaussRule *this_00;
  TPZGaussRule **ppTVar1;
  TPZIntRuleT *this_01;
  TPZIntRuleT **ppTVar2;
  TPZIntRuleT3D *this_02;
  TPZIntRuleT3D **ppTVar3;
  TPZIntRuleP3D *this_03;
  TPZIntRuleP3D **ppTVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (this->fintlist).fNElements;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      this_00 = (this->fintlist).fStore[lVar6];
      if (this_00 != (TPZGaussRule *)0x0) {
        TPZGaussRule::~TPZGaussRule(this_00);
        operator_delete(this_00,0x80);
      }
      lVar6 = lVar6 + 1;
      lVar5 = (this->fintlist).fNElements;
    } while (lVar6 < lVar5);
  }
  if (lVar5 != 0) {
    (this->fintlist).fNElements = 0;
    (this->fintlist).fNAlloc = 0;
    ppTVar1 = (this->fintlist).fStore;
    if (ppTVar1 != (TPZGaussRule **)0x0) {
      operator_delete__(ppTVar1);
    }
    (this->fintlist).fStore = (TPZGaussRule **)0x0;
  }
  lVar5 = (this->fintlistT).fNElements;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      this_01 = (this->fintlistT).fStore[lVar6];
      if (this_01 != (TPZIntRuleT *)0x0) {
        TPZIntRuleT::~TPZIntRuleT(this_01);
        operator_delete(this_01,0x260);
      }
      lVar6 = lVar6 + 1;
      lVar5 = (this->fintlistT).fNElements;
    } while (lVar6 < lVar5);
  }
  if (lVar5 != 0) {
    (this->fintlistT).fNElements = 0;
    (this->fintlistT).fNAlloc = 0;
    ppTVar2 = (this->fintlistT).fStore;
    if (ppTVar2 != (TPZIntRuleT **)0x0) {
      operator_delete__(ppTVar2);
    }
    (this->fintlistT).fStore = (TPZIntRuleT **)0x0;
  }
  lVar5 = (this->fintlistT3D).fNElements;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      this_02 = (this->fintlistT3D).fStore[lVar6];
      if (this_02 != (TPZIntRuleT3D *)0x0) {
        TPZIntRuleT3D::~TPZIntRuleT3D(this_02);
        operator_delete(this_02,800);
      }
      lVar6 = lVar6 + 1;
      lVar5 = (this->fintlistT3D).fNElements;
    } while (lVar6 < lVar5);
  }
  if (lVar5 != 0) {
    (this->fintlistT3D).fNElements = 0;
    (this->fintlistT3D).fNAlloc = 0;
    ppTVar3 = (this->fintlistT3D).fStore;
    if (ppTVar3 != (TPZIntRuleT3D **)0x0) {
      operator_delete__(ppTVar3);
    }
    (this->fintlistT3D).fStore = (TPZIntRuleT3D **)0x0;
  }
  lVar5 = (this->fintlistP3D).fNElements;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      this_03 = (this->fintlistP3D).fStore[lVar6];
      if (this_03 != (TPZIntRuleP3D *)0x0) {
        TPZIntRuleP3D::~TPZIntRuleP3D(this_03);
        operator_delete(this_03,0x90);
      }
      lVar6 = lVar6 + 1;
      lVar5 = (this->fintlistP3D).fNElements;
    } while (lVar6 < lVar5);
  }
  if (lVar5 != 0) {
    (this->fintlistP3D).fNElements = 0;
    (this->fintlistP3D).fNAlloc = 0;
    ppTVar4 = (this->fintlistP3D).fStore;
    if (ppTVar4 != (TPZIntRuleP3D **)0x0) {
      operator_delete__(ppTVar4);
    }
    (this->fintlistP3D).fStore = (TPZIntRuleP3D **)0x0;
  }
  (this->fintlistP3D)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01844518;
  ppTVar4 = (this->fintlistP3D).fStore;
  if (ppTVar4 != (TPZIntRuleP3D **)0x0) {
    operator_delete__(ppTVar4);
  }
  (this->fintlistT3D)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018444c8;
  ppTVar3 = (this->fintlistT3D).fStore;
  if (ppTVar3 != (TPZIntRuleT3D **)0x0) {
    operator_delete__(ppTVar3);
  }
  (this->fintlistT)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01844478;
  ppTVar2 = (this->fintlistT).fStore;
  if (ppTVar2 != (TPZIntRuleT **)0x0) {
    operator_delete__(ppTVar2);
  }
  (this->fintlist)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01844428;
  ppTVar1 = (this->fintlist).fStore;
  if (ppTVar1 != (TPZGaussRule **)0x0) {
    operator_delete__(ppTVar1);
    return;
  }
  return;
}

Assistant:

TPZIntRuleList::~TPZIntRuleList() {
	int i;
	/** Deleting dinamic allocation of the Gauss integration rules at the vector */
	for(i=0 ; i<fintlist.NElements() ; i++)   if (fintlist[i])   delete fintlist[i];
	fintlist.Resize(0);
	/** Deleting dinamic allocation of the cubature rules for triangle at the vector */
	for(i=0 ; i<fintlistT.NElements() ; i++)   if (fintlistT[i])   delete fintlistT[i];
	fintlistT.Resize(0);
	/** Deleting dinamic allocation of the cubature rules for tetrahedra at the vector */
	for(i=0 ; i<fintlistT3D.NElements() ; i++)   if (fintlistT3D[i])   delete fintlistT3D[i];
	fintlistT3D.Resize(0);
	
	/** Deleting dinamic allocation of the cubature rules for pyramid at the vector */
	for(i=0 ; i<fintlistP3D.NElements() ; i++)   if (fintlistP3D[i])   delete fintlistP3D[i];
	fintlistP3D.Resize(0);
}